

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::append_global_func_args
          (CompilerGLSL *this,SPIRFunction *func,uint32_t index,
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *arglist)

{
  uint uVar1;
  uint32_t id;
  Parameter *pPVar2;
  SPIRVariable *pSVar3;
  long lVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = (uint)(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
  ;
  iVar5 = uVar1 - index;
  if (index <= uVar1 && iVar5 != 0) {
    lVar4 = (ulong)index * 0x14;
    do {
      pPVar2 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
      if ((&pPVar2->alias_global_variable)[lVar4] == false) {
        __assert_fail("arg.alias_global_variable",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                      ,0x2ec9,
                      "void spirv_cross::CompilerGLSL::append_global_func_args(const SPIRFunction &, uint32_t, SmallVector<string> &)"
                     );
      }
      pSVar3 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)((long)&(pPVar2->id).id + lVar4));
      id = (pSVar3->basevariable).id;
      if (id != 0) {
        flush_variable_declaration(this,id);
      }
      (*(this->super_Compiler)._vptr_Compiler[0x1b])
                (&local_50,this,(long)&(pPVar2->type).id + lVar4,
                 (ulong)*(uint *)((long)&(pPVar2->id).id + lVar4));
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(arglist,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      lVar4 = lVar4 + 0x14;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  return;
}

Assistant:

void CompilerGLSL::append_global_func_args(const SPIRFunction &func, uint32_t index, SmallVector<string> &arglist)
{
	auto &args = func.arguments;
	uint32_t arg_cnt = uint32_t(args.size());
	for (uint32_t arg_idx = index; arg_idx < arg_cnt; arg_idx++)
	{
		auto &arg = args[arg_idx];
		assert(arg.alias_global_variable);

		// If the underlying variable needs to be declared
		// (ie. a local variable with deferred declaration), do so now.
		uint32_t var_id = get<SPIRVariable>(arg.id).basevariable;
		if (var_id)
			flush_variable_declaration(var_id);

		arglist.push_back(to_func_call_arg(arg, arg.id));
	}
}